

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void get_entropy_contexts_plane
               (BLOCK_SIZE plane_bsize,macroblockd_plane *pd,ENTROPY_CONTEXT *t_above,
               ENTROPY_CONTEXT *t_left)

{
  byte bVar1;
  void *__src;
  void *in_RCX;
  void *in_RDX;
  long in_RSI;
  byte in_DIL;
  ENTROPY_CONTEXT *left;
  ENTROPY_CONTEXT *above;
  int num_4x4_h;
  int num_4x4_w;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DIL];
  __src = *(void **)(in_RSI + 0x78);
  memcpy(in_RDX,*(void **)(in_RSI + 0x70),
         (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [in_DIL]);
  memcpy(in_RCX,__src,(long)(int)(uint)bVar1);
  return;
}

Assistant:

static void get_entropy_contexts_plane(BLOCK_SIZE plane_bsize,
                                       const struct macroblockd_plane *pd,
                                       ENTROPY_CONTEXT t_above[MAX_MIB_SIZE],
                                       ENTROPY_CONTEXT t_left[MAX_MIB_SIZE]) {
  const int num_4x4_w = mi_size_wide[plane_bsize];
  const int num_4x4_h = mi_size_high[plane_bsize];
  const ENTROPY_CONTEXT *const above = pd->above_entropy_context;
  const ENTROPY_CONTEXT *const left = pd->left_entropy_context;

  memcpy(t_above, above, sizeof(ENTROPY_CONTEXT) * num_4x4_w);
  memcpy(t_left, left, sizeof(ENTROPY_CONTEXT) * num_4x4_h);
}